

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O0

BN_CTX * BN_CTX_new(void)

{
  BN_CTX *ret;
  size_t in_stack_fffffffffffffff0;
  BN_POOL *local_8;
  
  local_8 = (BN_POOL *)CRYPTO_zalloc(in_stack_fffffffffffffff0);
  if (local_8 == (BN_POOL *)0x0) {
    local_8 = (BN_POOL *)0x0;
  }
  else {
    BN_POOL_init(local_8);
    BN_STACK_init((BN_STACK *)(local_8 + 1));
  }
  return (BN_CTX *)local_8;
}

Assistant:

BN_CTX *BN_CTX_new(void)
{
    BN_CTX *ret;

    if ((ret = CRYPTO_zalloc(sizeof(*ret))) == NULL) {
        //BNerr(BN_F_BN_CTX_NEW, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    /* Initialise the structure */
    BN_POOL_init(&ret->pool);
    BN_STACK_init(&ret->stack);
    return ret;
}